

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::TPZFrontMatrix
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *cp)

{
  long in_RSI;
  TPZVec<int> *in_RDI;
  TPZAbstractFrontMatrix<double> *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  TPZVec<int> *copy;
  TPZStackEqnStorage<double> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<double,TPZStackEqnStorage<double>,TPZFrontSym<double>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZAbstractFrontMatrix<double>::TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<double> *)in_RDI,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZFrontMatrix_02542b88;
  TPZStackEqnStorage<double>::TPZStackEqnStorage
            (in_stack_ffffffffffffffd0,(TPZStackEqnStorage<double> *)(in_RDI + 1));
  copy = (TPZVec<int> *)&in_RDI[0xfcf].fStore;
  TPZFrontSym<double>::TPZFrontSym((TPZFrontSym<double> *)in_RDI,(TPZFrontSym<double> *)copy);
  in_RDI[0xfd8].fNElements = *(int64_t *)(in_RSI + 0x1fb10);
  in_RDI[0xfd8].fNAlloc = *(int64_t *)(in_RSI + 0x1fb18);
  TPZVec<int>::TPZVec(in_RDI,copy);
  TPZVec<int>::TPZVec(in_RDI,copy);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }